

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nap_comm.cpp
# Opt level: O3

void __thiscall RandomCommTest_TestsInTests_Test::TestBody(RandomCommTest_TestsInTests_Test *this)

{
  int *piVar1;
  uint *puVar2;
  pointer *this_00;
  pointer *this_01;
  int iVar3;
  int iVar4;
  int iVar5;
  mapped_type mVar6;
  int *piVar7;
  topo_data *mpi_comm;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 orig_procs;
  undefined8 orig_procs_00;
  bool bVar10;
  uint uVar11;
  value_type_conflict2 *__val_1;
  topo_data *ptVar12;
  NAPComm *pNVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> *pvVar15;
  mapped_type *pmVar16;
  comm_data *pcVar17;
  void *pvVar18;
  long lVar19;
  long lVar20;
  value_type_conflict *__val;
  int iVar21;
  ulong uVar22;
  MPIX_Data *pMVar23;
  char *pcVar24;
  long lVar25;
  comm_data *pcVar26;
  MPIX_Data *pMVar27;
  pointer piVar28;
  size_type sVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int node;
  int rank;
  int local_rank;
  int num_procs_2;
  vector<double,_std::allocator<double>_> send_d_vals;
  vector<double,_std::allocator<double>_> nap_recv_d_vals;
  vector<double,_std::allocator<double>_> std_recv_d_vals;
  vector<int,_std::allocator<int>_> nap_recv_vals;
  vector<int,_std::allocator<int>_> std_recv_vals;
  int rank_2;
  vector<int,_std::allocator<int>_> send_vals;
  NAPData nap_data;
  vector<int,_std::allocator<int>_> recv_node_to_local;
  vector<int,_std::allocator<int>_> recv_nodes;
  vector<int,_std::allocator<int>_> send_idx_nodes;
  int num_procs;
  int num_procs_1;
  int rank_1;
  int local_num_procs;
  MPIX_Data recv_data;
  vector<int,_std::allocator<int>_> global_recv_idx;
  vector<int,_std::allocator<int>_> global_send_idx;
  MPIX_Data send_data;
  pointer in_stack_fffffffffffffc88;
  undefined1 uVar33;
  undefined8 in_stack_fffffffffffffc90;
  comm_data *pcVar34;
  topo_data *abs_error;
  undefined4 uVar35;
  undefined4 in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb0;
  uint uVar36;
  int local_348;
  allocator_type local_341;
  NAPComm *local_340;
  ulong local_338;
  int local_330;
  int local_32c;
  vector<double,_std::allocator<double>_> local_328;
  void *local_308;
  topo_data *local_300;
  vector<double,_std::allocator<double>_> local_2f8;
  topo_data local_2d8;
  vector<int,_std::allocator<int>_> local_2b8;
  comm_data *local_2a0;
  ulong local_298;
  vector<int,_std::allocator<int>_> local_290;
  int local_274;
  value_type_conflict local_270;
  int local_26c;
  undefined1 local_268 [8];
  _Rb_tree_node_base _Stack_260;
  size_t local_240;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_238;
  topo_data local_208;
  vector<int,_std::allocator<int>_> local_1e8;
  long local_1c8;
  int *local_1c0;
  int *local_1b8;
  int *local_1b0;
  vector<int,_std::allocator<int>_> local_1a8;
  size_type local_188;
  long local_180;
  pointer local_178;
  undefined1 local_170 [4];
  undefined1 local_16c [4];
  undefined1 local_168 [4];
  undefined1 local_164 [4];
  undefined1 local_160 [24];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  pointer local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  undefined1 local_b0 [24];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_348);
  MPI_Comm_size(&ompi_mpi_comm_world,local_170);
  setenv("PPN","4",1);
  local_38 = (pointer)0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_b0._8_16_ = (undefined1  [16])0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_160._8_16_ = (undefined1  [16])0x0;
  form_initial_communicator(10000,(MPIX_Data *)local_b0,(MPIX_Data *)local_160);
  iVar21 = local_348 * 10000;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(long)(int)local_b0._4_4_,(allocator_type *)&local_238);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,(long)(int)local_160._4_4_,(allocator_type *)&local_238);
  for (lVar14 = 0; lVar14 < (int)local_b0._0_4_; lVar14 = lVar14 + 1) {
    iVar3 = *(pointer)(local_b0._8_8_ + lVar14 * 4);
    iVar4 = *(int *)(local_98._8_8_ + lVar14 * 4);
    iVar5 = *(int *)(local_98._8_8_ + (lVar14 + 1) * 4);
    if (iVar4 < iVar5) {
      lVar25 = (long)iVar4;
      do {
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar25] = *(int *)(local_78._0_8_ + lVar25 * 4) + iVar21;
        lVar25 = lVar25 + 1;
      } while (iVar5 != lVar25);
    }
    in_stack_fffffffffffffc88 = (pointer)(local_68._8_8_ + lVar14 * 8);
    MPI_Isend(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + iVar4,iVar5 - iVar4,&ompi_mpi_int,iVar3,0x72aa,&ompi_mpi_comm_world,
              in_stack_fffffffffffffc88);
  }
  lVar25 = 0;
  lVar14 = 0;
  while( true ) {
    uVar35 = (undefined4)((ulong)in_stack_fffffffffffffc88 >> 0x20);
    uVar33 = (undefined1)in_stack_fffffffffffffc90;
    uVar22 = (ulong)(int)local_160._0_4_;
    if ((long)uVar22 <= lVar25) break;
    piVar28 = (pointer)(local_160._8_8_ + lVar25 * 4);
    piVar1 = (int *)(local_148._8_8_ + lVar25 * 4);
    lVar19 = lVar25 + 1;
    lVar25 = lVar25 + 1;
    in_stack_fffffffffffffc88 = (pointer)(lVar14 + local_118._8_8_);
    MPI_Irecv(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + *piVar1,*(int *)(local_148._8_8_ + lVar19 * 4) - *piVar1,&ompi_mpi_int,
              *piVar28,0x72aa,&ompi_mpi_comm_world,in_stack_fffffffffffffc88);
    lVar14 = lVar14 + 8;
  }
  if (local_b0._0_4_ != 0) {
    MPI_Waitall(local_b0._0_4_,local_68._8_8_,0);
    uVar22 = (ulong)(uint)local_160._0_4_;
  }
  if ((int)uVar22 == 0) {
    local_160._0_4_ = 0;
  }
  else {
    MPI_Waitall(uVar22,local_118._8_8_,0);
  }
  piVar28 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  orig_procs_00 = local_b0._8_8_;
  local_1b8 = (int *)local_98._8_8_;
  local_178 = (pointer)local_78._0_8_;
  orig_procs = local_160._8_8_;
  local_1c0 = (int *)local_148._8_8_;
  local_1b0 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
  MPI_Comm_rank(&ompi_mpi_comm_world,local_168);
  MPI_Comm_size(&ompi_mpi_comm_world,local_16c);
  ptVar12 = (topo_data *)operator_new(0x18);
  topo_data::topo_data(ptVar12,(MPI_Comm)&ompi_mpi_comm_world);
  pNVar13 = (NAPComm *)operator_new(0x40);
  local_300 = ptVar12;
  NAPComm::NAPComm(pNVar13,ptVar12);
  piVar1 = local_1b8;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2d8.local_comm = (MPI_Comm)0x0;
  local_2d8.rank_ordering = 0;
  local_2d8.ppn = 0;
  local_2d8.num_nodes = 0;
  local_2d8.rank_node = 0;
  map_procs_to_nodes(pNVar13,local_b0._0_4_,(int *)orig_procs_00,local_1b8,
                     (vector<int,_std::allocator<int>_> *)&local_328,
                     (vector<int,_std::allocator<int>_> *)&local_2d8,(MPI_Comm)CONCAT44(uVar35,1),
                     (bool)uVar33);
  mpi_comm = local_300;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar26 = pNVar13->local_S_comm->send_data;
  pcVar17 = pNVar13->local_S_comm->recv_data;
  pcVar34 = pNVar13->local_L_comm->send_data;
  ptVar12 = &local_2d8;
  local_180 = (long)(int)local_b0._0_4_;
  form_local_comm(local_b0._0_4_,(int *)orig_procs_00,piVar1,local_1b0,
                  (vector<int,_std::allocator<int>_> *)ptVar12,pcVar26,pcVar17,pcVar34,
                  (vector<int,_std::allocator<int>_> *)&local_2f8,(MPI_Comm)local_300,
                  (topo_data *)CONCAT44(in_stack_fffffffffffffcac,0x4c1b),in_stack_fffffffffffffcb0)
  ;
  uVar33 = SUB81(pcVar34,0);
  form_global_comm(pNVar13->local_S_comm->recv_data,pNVar13->global_comm->send_data,
                   (vector<int,_std::allocator<int>_> *)&local_2f8,(MPI_Comm)mpi_comm,ptVar12,
                   (int)pcVar26);
  piVar1 = local_1c0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_208.local_comm = (MPI_Comm)0x0;
  local_208.rank_ordering = 0;
  local_208.ppn = 0;
  local_208.num_nodes = 0;
  local_208.rank_node = 0;
  uVar11 = local_160._0_4_;
  map_procs_to_nodes(pNVar13,local_160._0_4_,(int *)orig_procs,local_1c0,&local_1e8,
                     (vector<int,_std::allocator<int>_> *)&local_208,
                     (MPI_Comm)((ulong)pcVar17 & 0xffffffff00000000),(bool)uVar33);
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar26 = pNVar13->local_R_comm->send_data;
  pcVar17 = pNVar13->local_R_comm->recv_data;
  pcVar34 = pNVar13->local_L_comm->recv_data;
  uVar35 = 0x7d30;
  ptVar12 = &local_208;
  abs_error = mpi_comm;
  form_local_comm(local_160._0_4_,(int *)orig_procs,piVar1,piVar28,
                  (vector<int,_std::allocator<int>_> *)ptVar12,pcVar17,pcVar26,pcVar34,&local_1a8,
                  (MPI_Comm)mpi_comm,(topo_data *)CONCAT44(in_stack_fffffffffffffcac,0x7d30),
                  in_stack_fffffffffffffcb0);
  form_global_comm(pNVar13->local_R_comm->send_data,pNVar13->global_comm->recv_data,&local_1a8,
                   (MPI_Comm)mpi_comm,ptVar12,(int)pcVar17);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_26c);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_32c);
  MPI_Comm_rank(mpi_comm->local_comm,&local_330);
  MPI_Comm_size(mpi_comm->local_comm,local_164);
  sVar29 = (size_type)mpi_comm->num_nodes;
  local_338 = (ulong)(uint)pNVar13->global_comm->send_data->num_msgs;
  uVar36 = pNVar13->global_comm->recv_data->num_msgs;
  local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,sVar29,(value_type_conflict *)&local_290
             ,(allocator_type *)&local_2b8);
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_290,sVar29,(value_type_conflict *)&local_2b8,(allocator_type *)&local_270);
  iVar21 = uVar36 + (int)local_338;
  local_274 = iVar21;
  local_188 = sVar29;
  if (iVar21 == 0) {
    local_308 = (void *)0x0;
    local_2a0 = (comm_data *)0x0;
  }
  else {
    uVar22 = (long)iVar21 * 8;
    if (iVar21 < 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_2a0 = (comm_data *)operator_new__(uVar22);
    uVar22 = (long)iVar21 * 4;
    if (iVar21 < 0) {
      uVar22 = 0xffffffffffffffff;
    }
    local_308 = operator_new__(uVar22);
  }
  local_270 = 0;
  local_340 = pNVar13;
  local_298 = (ulong)uVar36;
  std::vector<int,_std::allocator<int>_>::vector(&local_2b8,(long)local_32c,&local_270,&local_341);
  if (0 < (int)local_338) {
    lVar14 = local_338 * 4;
    lVar25 = 0;
    pcVar17 = local_2a0;
    do {
      in_stack_fffffffffffffcb0 = *(int *)((long)local_340->global_comm->send_data->procs + lVar25);
      lVar19 = (long)local_300->ppn * (long)in_stack_fffffffffffffcb0 + (long)local_330;
      piVar1 = (int *)(CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar19 * 4);
      *piVar1 = *piVar1 + 1;
      *(int *)((long)local_308 + lVar25) = local_340->topo_info->rank_node;
      pcVar26 = pcVar17;
      MPI_Isend((long)local_308 + lVar25,1,&ompi_mpi_int,lVar19,0x1ea8c34,&ompi_mpi_comm_world);
      lVar25 = lVar25 + 4;
      pcVar17 = (comm_data *)&pcVar17->procs;
    } while (lVar14 - lVar25 != 0);
  }
  pvVar18 = local_308;
  lVar14 = (long)(int)local_338;
  local_1c8 = lVar14;
  if (0 < (int)local_298) {
    lVar25 = local_298 * 4;
    pcVar17 = (comm_data *)(&local_2a0->num_msgs + lVar14 * 2);
    lVar19 = 0;
    do {
      in_stack_fffffffffffffcb0 = *(int *)((long)local_340->global_comm->recv_data->procs + lVar19);
      lVar20 = (long)local_300->ppn * (long)in_stack_fffffffffffffcb0 + (long)local_330;
      piVar1 = (int *)(CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar20 * 4);
      *piVar1 = *piVar1 + 1;
      *(int *)((long)pvVar18 + lVar19 + lVar14 * 4) = local_340->topo_info->rank_node;
      pcVar26 = pcVar17;
      MPI_Isend((long)pvVar18 + lVar19 + lVar14 * 4,1,&ompi_mpi_int,lVar20,0x31f7ce2,
                &ompi_mpi_comm_world);
      lVar19 = lVar19 + 4;
      pcVar17 = (comm_data *)&pcVar17->procs;
    } while (lVar25 - lVar19 != 0);
  }
  MPI_Allreduce(1,CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_),local_32c,&ompi_mpi_int,
                &ompi_mpi_op_sum,&ompi_mpi_comm_world);
  iVar21 = *(int *)(CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) + (long)local_26c * 4);
  if (0 < iVar21) {
    do {
      pcVar26 = (comm_data *)&local_238;
      MPI_Probe(0xffffffff,0xffffffff,&ompi_mpi_comm_world,pcVar26);
      uVar8 = local_238._M_impl._0_4_;
      uVar9 = local_238._M_impl._4_4_;
      MPI_Recv(&stack0xfffffffffffffcb0,1,&ompi_mpi_int,local_238._M_impl._0_4_,
               local_238._M_impl._4_4_,&ompi_mpi_comm_world);
      pvVar15 = (vector<int,_std::allocator<int>_> *)local_268;
      if (uVar9 == 0x1ea8c34) {
        pvVar15 = &local_290;
      }
      (pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[in_stack_fffffffffffffcb0] = uVar8;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  sVar29 = local_188;
  pcVar17 = local_2a0;
  ptVar12 = local_300;
  if (local_274 != 0) {
    MPI_Waitall(local_274,local_2a0,0);
  }
  MPI_Allreduce(1,local_268,sVar29 & 0xffffffff,&ompi_mpi_int,&ompi_mpi_op_max,ptVar12->local_comm);
  MPI_Allreduce(1,CONCAT44(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_),sVar29 & 0xffffffff,&ompi_mpi_int
                ,&ompi_mpi_op_max,ptVar12->local_comm);
  piVar1 = local_1b8;
  if (0 < (int)local_338) {
    piVar7 = local_340->global_comm->send_data->procs;
    lVar14 = 0;
    do {
      in_stack_fffffffffffffcb0 = piVar7[lVar14];
      piVar7[lVar14] = *(int *)((long)local_268 + (long)in_stack_fffffffffffffcb0 * 4);
      lVar14 = lVar14 + 1;
    } while (local_1c8 != lVar14);
  }
  if (0 < (int)local_298) {
    piVar7 = local_340->global_comm->recv_data->procs;
    uVar22 = 0;
    do {
      in_stack_fffffffffffffcb0 = piVar7[uVar22];
      piVar7[uVar22] =
           *(int *)(CONCAT44(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) +
                   (long)in_stack_fffffffffffffcb0 * 4);
      uVar22 = uVar22 + 1;
    } while (local_298 != uVar22);
  }
  uVar36 = uVar11;
  if (pcVar17 != (comm_data *)0x0) {
    operator_delete__(pcVar17);
  }
  if (local_308 != (void *)0x0) {
    operator_delete__(local_308);
  }
  if ((void *)CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268);
  }
  iVar21 = piVar1[local_180];
  uVar11 = local_1c0[(int)uVar11];
  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_impl.super__Rb_tree_header._M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_260._M_left = (_Base_ptr)(local_268 + 8);
  _Stack_260._M_color = 0;
  _Stack_260._M_parent = (_Base_ptr)0x0;
  local_240 = 0;
  _Stack_260._M_right = _Stack_260._M_left;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (long)iVar21) {
    lVar14 = 0;
    do {
      mVar6 = *(mapped_type *)((long)local_178 + lVar14);
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_238,(key_type *)((long)local_1b0 + lVar14));
      *pmVar16 = mVar6;
      lVar14 = lVar14 + 4;
    } while ((long)iVar21 * 4 != lVar14);
  }
  pNVar13 = local_340;
  if (0 < (int)uVar11) {
    uVar22 = 0;
    do {
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_268,piVar28);
      *pmVar16 = (mapped_type)uVar22;
      uVar22 = uVar22 + 1;
      piVar28 = piVar28 + 1;
    } while (uVar11 != uVar22);
  }
  comm_data::remove_duplicates(pNVar13->global_comm->send_data);
  comm_data::remove_duplicates(pNVar13->global_comm->recv_data);
  comm_data::remove_duplicates(pNVar13->local_S_comm->send_data);
  comm_data::remove_duplicates(pNVar13->local_S_comm->recv_data);
  comm_data::remove_duplicates(pNVar13->local_R_comm->send_data);
  comm_data::remove_duplicates(pNVar13->local_R_comm->recv_data);
  map_indices(pNVar13->global_comm->send_data,pNVar13->local_S_comm->recv_data);
  map_indices(pNVar13->local_R_comm->send_data,pNVar13->global_comm->recv_data);
  map_indices(pNVar13->local_S_comm->send_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &local_238);
  map_indices(pNVar13->local_L_comm->send_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &local_238);
  map_indices(pNVar13->local_R_comm->recv_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              local_268);
  map_indices(pNVar13->local_L_comm->recv_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              local_268);
  piVar1 = pNVar13->local_S_comm->recv_data->indices;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  pcVar17 = pNVar13->global_comm->recv_data;
  if (pcVar17->indices != (int *)0x0) {
    operator_delete__(pcVar17->indices);
    pcVar17 = pNVar13->global_comm->recv_data;
  }
  pNVar13->local_S_comm->recv_data->indices = (int *)0x0;
  pcVar17->indices = (int *)0x0;
  NAPComm::finalize(pNVar13);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_268);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_238);
  if ((AssertHelperData *)
      local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (AssertHelperData *)0x0) {
    operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if (local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _local_268 = (undefined1  [16])0x0;
  _Stack_260._M_parent = (_Base_ptr)0x0;
  pvVar18 = operator_new(40000);
  local_268 = (undefined1  [8])pvVar18;
  lVar14 = 0;
  _Stack_260._M_parent = (_Base_ptr)((long)pvVar18 + 40000);
  memset(pvVar18,0,40000);
  _Stack_260._0_8_ = (_Base_ptr)((long)pvVar18 + 40000);
  uVar11 = local_348 * 10000;
  uVar30 = uVar11 | 1;
  uVar31 = uVar11 | 2;
  uVar32 = uVar11 | 3;
  do {
    puVar2 = (uint *)((long)pvVar18 + lVar14 * 4);
    *puVar2 = uVar11;
    puVar2[1] = uVar30;
    puVar2[2] = uVar31;
    puVar2[3] = uVar32;
    lVar14 = lVar14 + 4;
    uVar11 = uVar11 + 4;
    uVar30 = uVar30 + 4;
    uVar31 = uVar31 + 4;
    uVar32 = uVar32 + 4;
  } while (lVar14 != 10000);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_290,(long)(int)local_160._4_4_,(allocator_type *)&local_238);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_2b8,(long)(int)local_160._4_4_,(allocator_type *)&local_238);
  iVar21 = 0x153418;
  pMVar23 = (MPIX_Data *)local_b0;
  pMVar27 = (MPIX_Data *)local_160;
  standard_communication<int>
            ((vector<int,_std::allocator<int>_> *)local_268,&local_290,0xc0c1,
             (MPI_Datatype)&ompi_mpi_int,pMVar23,pMVar27);
  local_238._M_impl._0_16_ = (undefined1  [16])0x0;
  MPIX_INAPsend((void *)local_268,pNVar13,(MPI_Datatype)&local_238,iVar21,(MPI_Comm)pMVar23,
                (NAPData *)pMVar27);
  MPIX_INAPrecv((void *)CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_),pNVar13,
                (MPI_Datatype)&local_238,iVar21,(MPI_Comm)pMVar23,(NAPData *)pMVar27);
  MPIX_NAPwait(pNVar13,(NAPData *)&local_238);
  if (0 < (int)local_160._4_4_) {
    this_00 = &local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    lVar14 = 0;
    lVar25 = 0;
    do {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_328,"std_recv_vals[i]","nap_recv_vals[i]",
                 (int *)(CONCAT44(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar14),
                 (int *)(CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar14));
      if (local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2d8);
        if (local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish == (pointer)0x0) {
          pcVar24 = "";
        }
        else {
          pcVar24 = (char *)*local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_2f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bienz2[P]Streamline/tests/test_nap_comm.cpp"
                   ,0xfd,pcVar24);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f8,(Message *)&local_2d8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
        if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_2d8._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar10 = testing::internal::IsTrue(true), bVar10)) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_2d8._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)((long)*(double *)local_2d8._0_8_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        goto LAB_0011c7f3;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar25 = lVar25 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar25 < (int)local_160._4_4_);
  }
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar18 = operator_new(80000);
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pvVar18;
  lVar14 = 0;
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((long)pvVar18 + 80000);
  memset(pvVar18,0,80000);
  local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)pvVar18 + 80000);
  uVar11 = local_348 * 10000;
  uVar30 = uVar11 | 1;
  uVar31 = uVar11 | 2;
  uVar32 = uVar11 | 3;
  do {
    puVar2 = (uint *)((long)local_268 + lVar14 * 4);
    *puVar2 = uVar11;
    puVar2[1] = uVar30;
    puVar2[2] = uVar31;
    puVar2[3] = uVar32;
    lVar14 = lVar14 + 4;
    uVar11 = uVar11 + 4;
    uVar30 = uVar30 + 4;
    uVar31 = uVar31 + 4;
    uVar32 = uVar32 + 4;
  } while (lVar14 != 10000);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_2d8,(long)(int)local_160._4_4_,
             (allocator_type *)&local_2f8);
  pNVar13 = local_340;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2f8,(long)(int)local_160._4_4_,(allocator_type *)&local_1e8);
  iVar21 = 0x153418;
  pMVar23 = (MPIX_Data *)local_b0;
  pMVar27 = (MPIX_Data *)local_160;
  standard_communication<double>
            (&local_328,(vector<double,_std::allocator<double>_> *)&local_2d8,0xc0c1,
             (MPI_Datatype)&ompi_mpi_int,pMVar23,pMVar27);
  MPIX_INAPsend(local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,pNVar13,(MPI_Datatype)&local_238,iVar21,
                (MPI_Comm)pMVar23,(NAPData *)pMVar27);
  MPIX_INAPrecv(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,pNVar13,(MPI_Datatype)&local_238,iVar21,
                (MPI_Comm)pMVar23,(NAPData *)pMVar27);
  MPIX_NAPwait(pNVar13,(NAPData *)&local_238);
  if (0 < (int)local_160._4_4_) {
    this_01 = &local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    lVar14 = 0;
    do {
      testing::internal::DoubleNearPredFormat
                ((char *)pcVar34,(char *)pcVar26,(char *)0x11c60b,
                 (double)CONCAT44(uVar36,in_stack_fffffffffffffcb0),
                 (double)CONCAT44(in_stack_fffffffffffffcac,uVar35),(double)abs_error);
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ == (allocator_type)0x0) {
        testing::Message::Message((Message *)&local_208);
        if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish == (pointer)0x0) {
          pcVar24 = "";
        }
        else {
          pcVar24 = *(char **)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bienz2[P]Streamline/tests/test_nap_comm.cpp"
                   ,0x114,pcVar24);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_208)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
        if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_208._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar10 = testing::internal::IsTrue(true), bVar10)) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_208._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_208._0_8_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        goto LAB_0011c7c0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)local_160._4_4_);
  }
  pNVar13 = local_340;
  ptVar12 = local_340->topo_info;
  if (ptVar12 != (topo_data *)0x0) {
    MPI_Comm_free(&ptVar12->local_comm);
  }
  operator_delete(ptVar12);
  NAPComm::~NAPComm(pNVar13);
  operator_delete(pNVar13);
  setenv("PPN","16",1);
LAB_0011c7c0:
  if (local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if (local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0011c7f3:
  if ((void *)CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268);
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((pointer)local_118._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._8_8_);
  }
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._8_8_);
  }
  if ((pointer)local_160._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_160._8_8_);
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_);
  }
  if ((pointer)local_68._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._8_8_);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_);
  }
  if ((pointer)local_b0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._8_8_);
  }
  return;
}

Assistant:

TEST(RandomCommTest, TestsInTests)
{
    // Get MPI Information
    int rank, num_procs;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &num_procs);

    setenv("PPN", "4", 1);

    // Initial communication info (standard)
    int local_size = 10000; // Number of variables each rank stores
    MPIX_Data send_data;
    MPIX_Data recv_data;
    form_initial_communicator(local_size, &send_data, &recv_data);

    // Determine unique global indices (map from send indices to recv indicies)
    int first = local_size * rank;
    std::vector<int> global_send_idx(send_data.size_msgs);
    std::vector<int> global_recv_idx(recv_data.size_msgs);
    int tag = 29354;
    for (int i = 0; i < send_data.num_msgs; i++)
    {
        int proc = send_data.procs[i];
        int start = send_data.indptr[i];
        int end = send_data.indptr[i+1];
        for (int j = start; j < end; j++)
        {
            int idx = send_data.indices[j];
            global_send_idx[j] = first + idx;
        }
        MPI_Isend(&global_send_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &send_data.requests[i]);
    }
    for (int i = 0; i < recv_data.num_msgs; i++)
    {
        int proc = recv_data.procs[i];
        int start = recv_data.indptr[i];
        int end = recv_data.indptr[i+1];
        MPI_Irecv(&global_recv_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &recv_data.requests[i]);
    }
    if (send_data.num_msgs) MPI_Waitall(send_data.num_msgs, 
            send_data.requests.data(), MPI_STATUSES_IGNORE);
    if (recv_data.num_msgs) MPI_Waitall(recv_data.num_msgs, 
            recv_data.requests.data(), MPI_STATUSES_IGNORE);

    // Initializing node-aware communication package
    NAPComm* nap_comm;
    MPIX_NAPinit(send_data.num_msgs, send_data.procs.data(), 
            send_data.indptr.data(), send_data.indices.data(), 
            recv_data.num_msgs, recv_data.procs.data(), 
            recv_data.indptr.data(), global_send_idx.data(),
            global_recv_idx.data(), MPI_COMM_WORLD, &nap_comm);

    // Test correctness of communication
    std::vector<int> send_vals(local_size);
    int val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<int> std_recv_vals(recv_data.size_msgs);
    std::vector<int> nap_recv_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_vals, std_recv_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    NAPData nap_data;
    MPIX_INAPsend(send_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_EQ(std_recv_vals[i], nap_recv_vals[i]);
    }
    
    std::vector<double> send_d_vals(local_size);
    val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<double> std_recv_d_vals(recv_data.size_msgs);
    std::vector<double> nap_recv_d_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_d_vals, std_recv_d_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    MPIX_INAPsend(send_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_NEAR(std_recv_d_vals[i], nap_recv_d_vals[i], 1e-10);
    }

    MPIX_NAPDestroy(&nap_comm);

    setenv("PPN", "16", 1);
}